

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsFederate helicsGetFederateByName(char *fedName,HelicsError *err)

{
  string_view newError;
  string_view newError_00;
  char *pcVar1;
  element_type *this;
  FedObject *__s;
  int *in_RSI;
  long in_RDI;
  FedObject *fed;
  shared_ptr<MasterObjectHolder> mob;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  MasterObjectHolder *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  FederateType in_stack_ffffffffffffff1c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff20;
  allocator<char> local_d1 [41];
  MasterObjectHolder *in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  char local_28 [16];
  int *local_18;
  HelicsFederate local_8;
  
  if ((in_RSI == (int *)0x0) || (*in_RSI == 0)) {
    local_18 = in_RSI;
    if (in_RDI == 0) {
      if (in_RSI != (int *)0x0) {
        *in_RSI = -4;
        pcVar1 = local_28;
        getMasterHolder();
        std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1baca8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
        newError._M_str = pcVar1;
        newError._M_len = in_stack_fffffffffffffef8;
        pcVar1 = MasterObjectHolder::addErrorString(in_stack_fffffffffffffef0,newError);
        *(char **)(local_18 + 2) = pcVar1;
        std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bad00)
        ;
      }
      local_8 = (HelicsFederate)0x0;
    }
    else {
      getMasterHolder();
      this = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bad55);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      __s = MasterObjectHolder::findFed(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
      if (__s == (FedObject *)0x0) {
        if (local_18 != (int *)0x0) {
          *local_18 = -4;
          getMasterHolder();
          std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1bade5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff00,(char *)__s,(allocator<char> *)this);
          std::operator+(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffec0);
          newError_00._M_str = (char *)in_stack_ffffffffffffff00;
          newError_00._M_len = (size_t)__s;
          pcVar1 = MasterObjectHolder::addErrorString(this,newError_00);
          *(char **)(local_18 + 2) = pcVar1;
          std::__cxx11::string::~string(in_stack_fffffffffffffec0);
          std::__cxx11::string::~string(in_stack_fffffffffffffec0);
          std::allocator<char>::~allocator(local_d1);
          std::shared_ptr<MasterObjectHolder>::~shared_ptr
                    ((shared_ptr<MasterObjectHolder> *)0x1baeb4);
        }
        local_8 = (HelicsFederate)0x0;
      }
      else {
        std::shared_ptr<helics::Federate>::shared_ptr
                  ((shared_ptr<helics::Federate> *)in_stack_fffffffffffffec0,
                   (shared_ptr<helics::Federate> *)&stack0xffffffffffffff18);
        local_8 = generateNewHelicsFederateObject
                            ((shared_ptr<helics::Federate> *)in_stack_ffffffffffffff20._M_pi,
                             in_stack_ffffffffffffff1c);
        std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1bafa6);
      }
      std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bafdd);
    }
  }
  else {
    local_8 = (HelicsFederate)0x0;
  }
  return local_8;
}

Assistant:

HelicsFederate helicsGetFederateByName(const char* fedName, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (fedName == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString("fedName is empty");
        }
        return nullptr;
    }
    auto mob = getMasterHolder();
    auto* fed = mob->findFed(fedName);
    if (fed == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(fedName) + " is not an active federate identifier");
        }
        return nullptr;
    }
    return generateNewHelicsFederateObject(fed->fedptr, fed->type);
}